

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,
                   SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  anon_union_4_5_a3ff96c3_for_Inst_2 aVar1;
  bool bVar2;
  InstOp IVar3;
  reference pvVar4;
  ostream *this_00;
  size_type sVar5;
  reference pvVar6;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *in_RCX;
  value_type_conflict2 *in_RDX;
  int in_ESI;
  SparseSetT<void> *in_R8;
  value_type_conflict2 *in_R9;
  Inst *ip;
  int id;
  value_type_conflict2 *in_stack_fffffffffffffdd8;
  Prog *in_stack_fffffffffffffde0;
  value_type_conflict2 *in_stack_fffffffffffffde8;
  InstOp opcode;
  LogMessage *in_stack_fffffffffffffdf0;
  uint32_t in_stack_fffffffffffffdf8;
  InstOp in_stack_fffffffffffffdfc;
  ostream *in_stack_fffffffffffffe10;
  LogMessage *in_stack_fffffffffffffe20;
  LogMessage local_1c0;
  Inst *local_40;
  int local_34;
  value_type_conflict2 *local_30;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *local_20;
  value_type_conflict2 *local_18;
  int local_c;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  SparseSetT<void>::clear(in_R8);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x24579d);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
LAB_002457b2:
  do {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
    local_34 = *pvVar4;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x2457ed);
    while (bVar2 = SparseSetT<void>::contains
                             ((SparseSetT<void> *)
                              CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                              (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20)), !bVar2) {
      SparseSetT<void>::insert_new
                ((SparseSetT<void> *)in_stack_fffffffffffffde0,
                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      if ((local_34 != local_c) &&
         (bVar2 = SparseArray<int>::has_index
                            ((SparseArray<int> *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                             (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20)), bVar2)) {
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        Inst::set_opcode((Inst *)in_stack_fffffffffffffdf0,
                         (InstOp)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        in_stack_fffffffffffffe20 =
             (LogMessage *)
             std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                       ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                        in_stack_fffffffffffffde0);
        SparseArray<int>::get_existing
                  ((SparseArray<int> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        Inst::set_out((Inst *)in_stack_fffffffffffffdf0,
                      (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        break;
      }
      local_40 = inst(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
      IVar3 = Inst::opcode(local_40);
      opcode = (InstOp)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      switch((char *)(ulong)IVar3) {
      case (char *)0x1:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        Inst::set_opcode((Inst *)in_stack_fffffffffffffdf0,opcode);
        in_stack_fffffffffffffdf0 =
             (LogMessage *)
             std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                       ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                        in_stack_fffffffffffffde0);
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(local_20);
        Inst::set_out((Inst *)in_stack_fffffffffffffdf0,opcode);
        sVar5 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(local_20);
        in_stack_fffffffffffffdf8 = (int)sVar5 + 1;
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            in_stack_fffffffffffffde0);
        (pvVar6->field_1).out1_ = in_stack_fffffffffffffdf8;
      case (char *)0x0:
        in_stack_fffffffffffffde8 = local_30;
        Inst::out1(local_40);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffdd8);
        local_34 = Inst::out(local_40);
        break;
      case (char *)0x2:
      case (char *)0x3:
      case (char *)0x4:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            in_stack_fffffffffffffde0);
        aVar1 = local_40->field_1;
        pvVar6->out_opcode_ = local_40->out_opcode_;
        pvVar6->field_1 = aVar1;
        in_stack_fffffffffffffde0 =
             (Prog *)std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                               ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                                in_stack_fffffffffffffde0);
        in_stack_fffffffffffffdd8 = local_18;
        Inst::out(local_40);
        SparseArray<int>::get_existing
                  ((SparseArray<int> *)in_stack_fffffffffffffde0,
                   (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
        Inst::set_out((Inst *)in_stack_fffffffffffffdf0,
                      (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        goto LAB_002457b2;
      case (char *)0x5:
      case (char *)0x7:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                   in_stack_fffffffffffffde0);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                            in_stack_fffffffffffffde0);
        aVar1 = local_40->field_1;
        pvVar6->out_opcode_ = local_40->out_opcode_;
        pvVar6->field_1 = aVar1;
        goto LAB_002457b2;
      case (char *)0x6:
        local_34 = Inst::out(local_40);
        break;
      default:
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe20,(char *)(ulong)IVar3,
                   (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        in_stack_fffffffffffffe10 = LogMessage::stream(&local_1c0);
        this_00 = std::operator<<(in_stack_fffffffffffffe10,"unhandled opcode: ");
        in_stack_fffffffffffffdfc = Inst::opcode(local_40);
        std::ostream::operator<<(this_00,in_stack_fffffffffffffdfc);
        LogMessage::~LogMessage(in_stack_fffffffffffffdf0);
        goto LAB_002457b2;
      }
    }
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}